

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O2

BinaryPacketProtocol *
ssh_verstring_new(Conf *conf,LogContext *logctx,_Bool bare_connection_mode,char *protoversion,
                 ssh_version_receiver *rcv,_Bool server_mode,char *impl_name)

{
  _Bool _Var1;
  int iVar2;
  void *__s;
  Conf *pCVar3;
  strbuf *psVar4;
  char *pcVar5;
  undefined7 in_register_00000011;
  undefined8 uVar6;
  undefined3 in_register_00000089;
  bool bVar7;
  
  __s = safemalloc(1,400,0);
  memset(__s,0,400);
  pcVar5 = "SSH-";
  bVar7 = (int)CONCAT71(in_register_00000011,bare_connection_mode) != 0;
  if (bVar7) {
    pcVar5 = "SSHCONNECTION@putty.projects.tartarus.org-";
  }
  uVar6 = 4;
  if (bVar7) {
    uVar6 = 0x2a;
  }
  *(char **)((long)__s + 0x10) = pcVar5;
  *(undefined8 *)((long)__s + 0x18) = uVar6;
  pCVar3 = conf_copy(conf);
  *(Conf **)((long)__s + 8) = pCVar3;
  *(LogContext **)((long)__s + 0x148) = logctx;
  pcVar5 = dupstr(protoversion);
  *(char **)((long)__s + 0x20) = pcVar5;
  *(ssh_version_receiver **)((long)__s + 0x28) = rcv;
  pcVar5 = dupstr(impl_name);
  *(char **)((long)__s + 0x80) = pcVar5;
  psVar4 = strbuf_new();
  *(strbuf **)((long)__s + 0x88) = psVar4;
  bVar7 = true;
  if (CONCAT31(in_register_00000089,server_mode) == 0) {
    _Var1 = ssh_version_includes_v1(protoversion);
    bVar7 = !_Var1;
  }
  *(bool *)((long)__s + 0x30) = bVar7;
  iVar2 = conf_get_int(*(Conf **)((long)__s + 8),0xbe);
  if (iVar2 == 0) {
    *(undefined1 *)((long)__s + 0x30) = 0;
  }
  *(BinaryPacketProtocolVtable **)((long)__s + 0xb0) = &ssh_verstring_vtable;
  ssh_bpp_common_setup((BinaryPacketProtocol *)((long)__s + 0xb0));
  return (BinaryPacketProtocol *)((long)__s + 0xb0);
}

Assistant:

BinaryPacketProtocol *ssh_verstring_new(
    Conf *conf, LogContext *logctx, bool bare_connection_mode,
    const char *protoversion, struct ssh_version_receiver *rcv,
    bool server_mode, const char *impl_name)
{
    struct ssh_verstring_state *s = snew(struct ssh_verstring_state);

    memset(s, 0, sizeof(struct ssh_verstring_state));

    if (!bare_connection_mode) {
        s->prefix_wanted = PTRLEN_LITERAL("SSH-");
    } else {
        /*
         * Ordinary SSH begins with the banner "SSH-x.y-...". Here,
         * we're going to be speaking just the ssh-connection
         * subprotocol, extracted and given a trivial binary packet
         * protocol, so we need a new banner.
         *
         * The new banner is like the ordinary SSH banner, but
         * replaces the prefix 'SSH-' at the start with a new name. In
         * proper SSH style (though of course this part of the proper
         * SSH protocol _isn't_ subject to this kind of
         * DNS-domain-based extension), we define the new name in our
         * extension space.
         */
        s->prefix_wanted = PTRLEN_LITERAL(
            "SSHCONNECTION@putty.projects.tartarus.org-");
    }
    assert(s->prefix_wanted.len <= PREFIX_MAXLEN);

    s->conf = conf_copy(conf);
    s->bpp.logctx = logctx;
    s->our_protoversion = dupstr(protoversion);
    s->receiver = rcv;
    s->impl_name = dupstr(impl_name);
    s->vstring = strbuf_new();

    /*
     * We send our version string early if we can. But if it includes
     * SSH-1, we can't, because we have to take the other end into
     * account too (see below).
     *
     * In server mode, we do send early.
     */
    s->send_early = server_mode || !ssh_version_includes_v1(protoversion);

    /*
     * Override: we don't send our version string early if the server
     * has a bug that will make it discard it. See for example
     * https://bugs.debian.org/cgi-bin/bugreport.cgi?bug=991958
     */
    if (conf_get_int(s->conf, CONF_sshbug_dropstart) == FORCE_ON)
        s->send_early = false;

    s->bpp.vt = &ssh_verstring_vtable;
    ssh_bpp_common_setup(&s->bpp);
    return &s->bpp;
}